

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

int PAL_fputs(char *str,PAL_FILE *f)

{
  int iVar1;
  INT nRetVal;
  PAL_FILE *f_local;
  char *str_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (str == (char *)0x0) {
    fprintf(_stderr,"] %s %s:%d","PAL_fputs",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/file.cpp"
            ,0x28b);
    fprintf(_stderr,"Expression: str != NULL\n");
  }
  if (f == (PAL_FILE *)0x0) {
    fprintf(_stderr,"] %s %s:%d","PAL_fputs",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/file.cpp"
            ,0x28c);
    fprintf(_stderr,"Expression: f != NULL\n");
  }
  iVar1 = fputs(str,(FILE *)f->bsdFilePtr);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return iVar1;
}

Assistant:

int
_cdecl
PAL_fputs(const char * str,  PAL_FILE * f)
{
    INT nRetVal = 0;

    PERF_ENTRY(fputs);
    ENTRY( "fputs( %p (%s), %p )\n", str, str, f);

    _ASSERTE(str != NULL);
    _ASSERTE(f != NULL);

    CLEARERR(f);

    nRetVal = fputs( str, f->bsdFilePtr );

    LOGEXIT( "fputs returning %d\n", nRetVal );
    PERF_EXIT(fputs);
    return nRetVal;
}